

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureViewVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::TextureViewVkImpl::~TextureViewVkImpl(TextureViewVkImpl *this)

{
  FramebufferCache *this_00;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  RenderDeviceVkImpl *this_01;
  
  this_01 = (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
            .m_pDevice;
  this_00 = (this_01->m_FramebufferCache)._M_t.
            super___uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::FramebufferCache_*,_std::default_delete<Diligent::FramebufferCache>_>
            .super__Head_base<0UL,_Diligent::FramebufferCache_*,_false>._M_head_impl;
  if (((this_00 != (FramebufferCache *)0x0) &&
      (uVar1 = (uint)(this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                     .m_Desc.ViewType, uVar1 < 7)) && ((0x5cU >> (uVar1 & 0x1f) & 1) != 0)) {
    FramebufferCache::OnDestroyImageView(this_00,(this->m_ImageView).m_VkObject);
    this_01 = (this->super_TextureViewBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
              .m_pDevice;
  }
  iVar2 = (*(((this->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
            super_IDeviceObject).super_IObject._vptr_IObject[4])();
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::
  SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkImageView_T*,(VulkanUtilities::VulkanHandleTypeId)5>,void>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)this_01,&this->m_ImageView,*(Uint64 *)(CONCAT44(extraout_var,iVar2) + 0x48));
  VulkanUtilities::VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5>::
  ~VulkanObjectWrapper(&this->m_ImageView);
  TextureViewBase<Diligent::EngineVkImplTraits>::~TextureViewBase
            (&this->super_TextureViewBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

TextureViewVkImpl::~TextureViewVkImpl()
{
    if (FramebufferCache* FBCache = m_pDevice->GetFramebufferCache())
    {
        if (m_Desc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
            m_Desc.ViewType == TEXTURE_VIEW_SHADING_RATE)
        {
            FBCache->OnDestroyImageView(m_ImageView);
        }
    }
    m_pDevice->SafeReleaseDeviceObject(std::move(m_ImageView), m_pTexture->GetDesc().ImmediateContextMask);
}